

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall StringOutput::rawprint(StringOutput *this,char *data,size_t size)

{
  string *this_00;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->mutex);
  this_00 = this->result;
  std::__cxx11::string::insert<char_const*,void>
            ((string *)this_00,
             (const_iterator)((this_00->_M_dataplus)._M_p + this_00->_M_string_length),data,
             data + size);
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

virtual void rawprint(const char* data, size_t size)
	{
		std::unique_lock<std::mutex> lock(mutex);

		result.insert(result.end(), data, data + size);
	}